

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void __thiscall
CustomUintFormatter<8,false>::
Ser<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>,ServiceFlags>
          (CustomUintFormatter<8,false> *this,
          ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *s,ServiceFlags v)

{
  size_t in_RCX;
  long in_FS_OFFSET;
  uint64_t raw;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  raw = v;
  ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams>::write
            (s,(int)&raw,(void *)0x8,in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, I v)
    {
        if (v < 0 || v > MAX) throw std::ios_base::failure("CustomUintFormatter value out of range");
        if (BigEndian) {
            uint64_t raw = htobe64_internal(v);
            s.write(AsBytes(Span{&raw, 1}).last(Bytes));
        } else {
            uint64_t raw = htole64_internal(v);
            s.write(AsBytes(Span{&raw, 1}).first(Bytes));
        }
    }